

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_34;
  int res_1;
  int n;
  size_t i;
  int sum;
  int res;
  size_t N;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  N = (size_t)argv;
  argv_local._0_4_ = argc;
  while( true ) {
    while( true ) {
      printf("Enter how many numbers you\'d like to input (3-10): ");
      i._4_4_ = __isoc99_scanf("%zu",&sum);
      if (i._4_4_ == 1) break;
      if (i._4_4_ != 0) {
        printf("\n");
        return 0;
      }
      printf("Not a valid number!\n");
      __isoc99_scanf("%*[^\n]");
    }
    if ((2 < _sum) && (_sum < 0xb)) break;
    printf("Must be between 3 and 10!\n");
  }
  i._0_4_ = 0;
  _res_1 = 0;
  i._4_4_ = 1;
  do {
    if (_sum <= _res_1) {
      printf("The sum of these numbers is %d.\n",(ulong)(uint)i);
      return 0;
    }
    printf("%zu-th number: ",_res_1 + 1);
    iVar1 = __isoc99_scanf("%d",&local_34);
    if (iVar1 == 0) {
      printf("Not a valid number!\n");
      __isoc99_scanf("%*[^\n]");
      _res_1 = _res_1 - 1;
    }
    else {
      if (iVar1 == -1) {
        printf("\n");
        return 0;
      }
      i._0_4_ = local_34 + (uint)i;
    }
    _res_1 = _res_1 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  size_t N;

  while (true) { // Input N
    printf("Enter how many numbers you'd like to input (3-10): ");
    int res = scanf("%zu", &N);
    if (res == 1) {
      if (N > 2 && N < 11) break;
      else {
        printf("Must be between 3 and 10!\n");
      }
    } else if (res == 0) {
      printf("Not a valid number!\n");
      scanf("%*[^\n]");
    } else {
      printf("\n");
      return 0;
    }
  }

  int sum = 0;

  for (size_t i = 0; i < N; i++) { // input each number and add it to sum
    int n;
    printf("%zu-th number: ", i + 1);

    const int res = scanf("%d", &n);
    if (res == 0) {
      printf("Not a valid number!\n");
      scanf("%*[^\n]");
      i--;
    } else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      sum += n;
    }
  }

  printf("The sum of these numbers is %d.\n", sum);

  return 0;
}